

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearForce.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorLinearForce::IntLoadResidual_F
          (ChLinkMotorLinearForce *this,uint off,ChVectorDynamic<> *R,double c)

{
  long *plVar1;
  ulong *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  element_type *peVar12;
  ChBodyFrame *pCVar13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar29;
  double *pdVar30;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Index index;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  undefined4 in_register_00000034;
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  double dVar41;
  undefined8 in_XMM0_Qb;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  Vector mbody_torque;
  Vector mbody_force;
  Vector m_abs_force;
  ChFrame<double> aframe1;
  ChFrame<double> aframe2;
  ChVector<double> local_1b8;
  undefined1 local_198 [16];
  long alStack_188 [2];
  ChVector<double> CStack_178;
  long lStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  ChVector<double> local_140;
  ChFrame<double> local_128;
  ChFrame<double> local_a0;
  
  peVar12 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.m_func.
            super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar41 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
           super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  local_158 = c;
  uStack_150 = in_XMM0_Qb;
  (*peVar12->_vptr_ChFunction[4])(peVar12,CONCAT44(in_register_00000034,off));
  local_148 = dVar41;
  ChFrame<double>::operator>>
            (&local_128,
             &(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.frame1,
             (ChFrame<double> *)
             (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body1);
  ChFrame<double>::operator>>
            (&local_a0,
             &(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.frame2,
             (ChFrame<double> *)
             (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body2);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_148;
  auVar42 = ZEXT816(0) << 0x40;
  local_1b8.m_data[0] = 0.0;
  CStack_178.m_data[2] = 0.0;
  local_1b8.m_data[2] = 0.0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] * 0.0;
  auVar3 = vfmadd231sd_fma(auVar46,auVar52,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] * 0.0;
  auVar4 = vfmadd231sd_fma(auVar49,auVar52,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar3 = vfmadd231sd_fma(auVar3,auVar42,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar4 = vfmadd231sd_fma(auVar4,auVar42,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] * 0.0;
  auVar5 = vfmadd231sd_fma(auVar55,auVar52,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar5 = vfmadd231sd_fma(auVar5,auVar42,auVar8);
  CStack_178.m_data[1] = 0.0;
  local_1b8.m_data[1] = 0.0;
  local_140.m_data[0] = auVar3._0_8_;
  local_140.m_data[1] = auVar4._0_8_;
  local_140.m_data[2] = auVar5._0_8_;
  CStack_178.m_data[0] = local_1b8.m_data[0];
  iVar28 = (*(((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body2)->super_ChFrameMoving<double>).
             super_ChFrame<double>._vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var,iVar28) + 0x2c) == '\0') {
    ChBodyFrame::To_abs_forcetorque
              ((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body2,&local_140,&local_128.coord.pos,false,&CStack_178
               ,&local_1b8);
    iVar28 = (*(((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                 super_ChLinkMate.super_ChLink.Body2)->super_ChFrameMoving<double>).
               super_ChFrame<double>._vptr_ChFrame[0x10])();
    lVar29 = (long)*(int *)(CONCAT44(extraout_var_00,iVar28) + 0x30);
    if ((lVar29 < 0) ||
       ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
        lVar29)) goto LAB_005bc982;
    pdVar30 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
              lVar29;
    uVar31 = 3;
    if (((ulong)pdVar30 & 7) == 0) {
      uVar32 = -((uint)((ulong)pdVar30 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar32 < 3) {
        uVar31 = (ulong)uVar32;
      }
      if (uVar32 != 0) goto LAB_005bc61a;
    }
    else {
LAB_005bc61a:
      uVar34 = 0;
      do {
        pdVar30[uVar34] = pdVar30[uVar34] - local_158 * CStack_178.m_data[uVar34];
        uVar34 = uVar34 + 1;
      } while (uVar31 != uVar34);
    }
    if (uVar31 < 3) {
      do {
        pdVar30[uVar31] = pdVar30[uVar31] - local_158 * CStack_178.m_data[uVar31];
        uVar31 = uVar31 + 1;
      } while (uVar31 != 3);
    }
    pCVar13 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
              super_ChLinkMate.super_ChLink.Body2;
    auVar50._8_8_ = local_1b8.m_data[0];
    auVar50._0_8_ = local_1b8.m_data[0];
    auVar53._8_8_ = local_1b8.m_data[2];
    auVar53._0_8_ = local_1b8.m_data[2];
    auVar43._0_8_ =
         local_1b8.m_data[1] *
         (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar43._8_8_ =
         local_1b8.m_data[1] *
         (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar42._8_8_ = 0;
    auVar42._0_8_ =
         (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar47._8_8_ = 0;
    auVar47._0_8_ =
         local_1b8.m_data[1] *
         (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar4 = vfmadd231sd_fma(auVar47,auVar50,auVar42);
    auVar3 = vfmadd231pd_fma(auVar43,auVar50,
                             *(undefined1 (*) [16])
                              (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar4 = vfmadd231sd_fma(auVar4,auVar53,auVar9);
    local_198 = vfmadd231pd_fma(auVar3,auVar53,
                                *(undefined1 (*) [16])
                                 ((pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.
                                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array + 6));
    alStack_188[0] = auVar4._0_8_;
    iVar28 = (*(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
    lVar29 = (long)*(int *)(CONCAT44(extraout_var_01,iVar28) + 0x30);
    if ((lVar29 < -3) ||
       ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
        lVar29 + 3)) goto LAB_005bc982;
    auVar26._8_8_ = uStack_150;
    auVar26._0_8_ = local_158;
    pdVar30 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
              lVar29 + 3;
    uVar32 = 3;
    if (((ulong)pdVar30 & 7) == 0) {
      uVar33 = -((uint)((ulong)pdVar30 >> 3) & 0x1fffffff) & 7;
      if (uVar33 < 3) {
        uVar32 = uVar33;
      }
      if (uVar33 != 0) goto LAB_005bc700;
    }
    else {
LAB_005bc700:
      auVar36 = vbroadcastsd_avx512f(auVar26);
      auVar37 = vpbroadcastq_avx512f();
      uVar31 = vpcmpuq_avx512f(auVar37,_DAT_00968640,5);
      bVar14 = (byte)uVar31;
      auVar37._8_8_ = (ulong)((byte)(uVar31 >> 1) & 1) * local_198._8_8_;
      auVar37._0_8_ = (ulong)(bVar14 & 1) * local_198._0_8_;
      auVar37._16_8_ = (ulong)((byte)(uVar31 >> 2) & 1) * alStack_188[0];
      auVar37._24_8_ = (ulong)((byte)(uVar31 >> 3) & 1) * alStack_188[1];
      auVar37._32_8_ = (ulong)((byte)(uVar31 >> 4) & 1) * (long)CStack_178.m_data[0];
      auVar37._40_8_ = (ulong)((byte)(uVar31 >> 5) & 1) * (long)CStack_178.m_data[1];
      auVar37._48_8_ = (ulong)((byte)(uVar31 >> 6) & 1) * (long)CStack_178.m_data[2];
      auVar37._56_8_ = (uVar31 >> 7) * lStack_160;
      auVar38._8_8_ = (ulong)((byte)(uVar31 >> 1) & 1) * (long)pdVar30[1];
      auVar38._0_8_ = (ulong)(bVar14 & 1) * (long)*pdVar30;
      auVar38._16_8_ = (ulong)((byte)(uVar31 >> 2) & 1) * (long)pdVar30[2];
      auVar38._24_8_ = (ulong)((byte)(uVar31 >> 3) & 1) * (long)pdVar30[3];
      auVar38._32_8_ = (ulong)((byte)(uVar31 >> 4) & 1) * (long)pdVar30[4];
      auVar38._40_8_ = (ulong)((byte)(uVar31 >> 5) & 1) * (long)pdVar30[5];
      auVar38._48_8_ = (ulong)((byte)(uVar31 >> 6) & 1) * (long)pdVar30[6];
      auVar38._56_8_ = (uVar31 >> 7) * (long)pdVar30[7];
      auVar36 = vmulpd_avx512f(auVar37,auVar36);
      auVar36 = vsubpd_avx512f(auVar38,auVar36);
      bVar15 = (bool)((byte)(uVar31 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar31 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar31 >> 3) & 1);
      bVar18 = (bool)((byte)(uVar31 >> 4) & 1);
      bVar19 = (bool)((byte)(uVar31 >> 5) & 1);
      bVar20 = (bool)((byte)(uVar31 >> 6) & 1);
      *pdVar30 = (double)((ulong)(bVar14 & 1) * auVar36._0_8_ |
                         (ulong)!(bool)(bVar14 & 1) * (long)*pdVar30);
      pdVar30[1] = (double)((ulong)bVar15 * auVar36._8_8_ | (ulong)!bVar15 * (long)pdVar30[1]);
      pdVar30[2] = (double)((ulong)bVar16 * auVar36._16_8_ | (ulong)!bVar16 * (long)pdVar30[2]);
      pdVar30[3] = (double)((ulong)bVar17 * auVar36._24_8_ | (ulong)!bVar17 * (long)pdVar30[3]);
      pdVar30[4] = (double)((ulong)bVar18 * auVar36._32_8_ | (ulong)!bVar18 * (long)pdVar30[4]);
      pdVar30[5] = (double)((ulong)bVar19 * auVar36._40_8_ | (ulong)!bVar19 * (long)pdVar30[5]);
      pdVar30[6] = (double)((ulong)bVar20 * auVar36._48_8_ | (ulong)!bVar20 * (long)pdVar30[6]);
      pdVar30[7] = (double)((uVar31 >> 7) * auVar36._56_8_ |
                           (ulong)!SUB81(uVar31 >> 7,0) * (long)pdVar30[7]);
    }
    if (uVar32 < 3) {
      uVar34 = (ulong)(uVar32 << 3);
      auVar35 = vpbroadcastq_avx512vl();
      uVar31 = vpcmpuq_avx512vl(auVar35,_DAT_00955380,5);
      uVar31 = uVar31 & 0xf;
      bVar14 = (byte)uVar31;
      plVar1 = (long *)((long)pdVar30 + uVar34);
      auVar35._8_8_ = (ulong)((byte)(uVar31 >> 1) & 1) * plVar1[1];
      auVar35._0_8_ = (ulong)(bVar14 & 1) * *plVar1;
      auVar35._16_8_ = (ulong)((byte)(uVar31 >> 2) & 1) * plVar1[2];
      auVar35._24_8_ = (uVar31 >> 3) * plVar1[3];
      auVar45._0_8_ = (double)((ulong)(bVar14 & 1) * *(long *)(local_198 + uVar34)) * local_158;
      auVar45._8_8_ =
           (double)((ulong)((byte)(uVar31 >> 1) & 1) * *(long *)(local_198 + uVar34 + 8)) *
           local_158;
      auVar45._16_8_ =
           (double)((ulong)((byte)(uVar31 >> 2) & 1) * *(long *)((long)alStack_188 + uVar34)) *
           local_158;
      auVar45._24_8_ =
           (double)((uVar31 >> 3) * *(long *)((long)CStack_178.m_data + (uVar34 - 8))) * local_158;
      auVar35 = vsubpd_avx(auVar35,auVar45);
      puVar2 = (ulong *)((long)pdVar30 + uVar34);
      bVar15 = (bool)((byte)(uVar31 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar31 >> 2) & 1);
      *puVar2 = (ulong)(bVar14 & 1) * auVar35._0_8_ | (ulong)!(bool)(bVar14 & 1) * *puVar2;
      puVar2[1] = (ulong)bVar15 * auVar35._8_8_ | (ulong)!bVar15 * puVar2[1];
      puVar2[2] = (ulong)bVar16 * auVar35._16_8_ | (ulong)!bVar16 * puVar2[2];
      puVar2[3] = (uVar31 >> 3) * auVar35._24_8_ | (ulong)!SUB81(uVar31 >> 3,0) * puVar2[3];
    }
  }
  iVar28 = (*(((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body1)->super_ChFrameMoving<double>).
             super_ChFrame<double>._vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var_02,iVar28) + 0x2c) != '\0') {
    return;
  }
  ChBodyFrame::To_abs_forcetorque
            ((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body1,&local_140,&local_128.coord.pos,false,&CStack_178,
             &local_1b8);
  iVar28 = (*(((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body1)->super_ChFrameMoving<double>).
             super_ChFrame<double>._vptr_ChFrame[0x10])();
  lVar29 = (long)*(int *)(CONCAT44(extraout_var_03,iVar28) + 0x30);
  if ((lVar29 < 0) ||
     ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
      lVar29)) goto LAB_005bc982;
  pdVar30 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
            lVar29;
  uVar31 = 3;
  if (((ulong)pdVar30 & 7) == 0) {
    uVar32 = -((uint)((ulong)pdVar30 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar32 < 3) {
      uVar31 = (ulong)uVar32;
    }
    if (uVar32 != 0) goto LAB_005bc814;
  }
  else {
LAB_005bc814:
    uVar34 = 0;
    do {
      pdVar30[uVar34] = local_158 * CStack_178.m_data[uVar34] + pdVar30[uVar34];
      uVar34 = uVar34 + 1;
    } while (uVar31 != uVar34);
  }
  if (uVar31 < 3) {
    do {
      pdVar30[uVar31] = local_158 * CStack_178.m_data[uVar31] + pdVar30[uVar31];
      uVar31 = uVar31 + 1;
    } while (uVar31 != 3);
  }
  pCVar13 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
            super_ChLinkMate.super_ChLink.Body1;
  auVar51._8_8_ = local_1b8.m_data[0];
  auVar51._0_8_ = local_1b8.m_data[0];
  auVar54._8_8_ = local_1b8.m_data[2];
  auVar54._0_8_ = local_1b8.m_data[2];
  auVar44._0_8_ =
       local_1b8.m_data[1] *
       (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar44._8_8_ =
       local_1b8.m_data[1] *
       (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       local_1b8.m_data[1] *
       (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar4 = vfmadd231sd_fma(auVar48,auVar51,auVar10);
  auVar3 = vfmadd231pd_fma(auVar44,auVar51,
                           *(undefined1 (*) [16])
                            (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar4 = vfmadd231sd_fma(auVar4,auVar54,auVar11);
  local_198 = vfmadd231pd_fma(auVar3,auVar54,
                              *(undefined1 (*) [16])
                               ((pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix
                                .super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
  alStack_188[0] = auVar4._0_8_;
  iVar28 = (*(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  lVar29 = (long)*(int *)(CONCAT44(extraout_var_04,iVar28) + 0x30);
  if ((lVar29 < -3) ||
     ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
      lVar29 + 3)) {
LAB_005bc982:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  auVar27._8_8_ = uStack_150;
  auVar27._0_8_ = local_158;
  pdVar30 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
            lVar29 + 3;
  uVar32 = 3;
  if (((ulong)pdVar30 & 7) == 0) {
    uVar33 = -((uint)((ulong)pdVar30 >> 3) & 0x1fffffff) & 7;
    if (uVar33 < 3) {
      uVar32 = uVar33;
    }
    if (uVar33 == 0) goto LAB_005bc92d;
  }
  auVar36 = vbroadcastsd_avx512f(auVar27);
  auVar37 = vpbroadcastq_avx512f();
  uVar31 = vpcmpuq_avx512f(auVar37,_DAT_00968640,5);
  bVar14 = (byte)uVar31;
  auVar39._8_8_ = (ulong)((byte)(uVar31 >> 1) & 1) * local_198._8_8_;
  auVar39._0_8_ = (ulong)(bVar14 & 1) * local_198._0_8_;
  auVar39._16_8_ = (ulong)((byte)(uVar31 >> 2) & 1) * alStack_188[0];
  auVar39._24_8_ = (ulong)((byte)(uVar31 >> 3) & 1) * alStack_188[1];
  auVar39._32_8_ = (ulong)((byte)(uVar31 >> 4) & 1) * (long)CStack_178.m_data[0];
  auVar39._40_8_ = (ulong)((byte)(uVar31 >> 5) & 1) * (long)CStack_178.m_data[1];
  auVar39._48_8_ = (ulong)((byte)(uVar31 >> 6) & 1) * (long)CStack_178.m_data[2];
  auVar39._56_8_ = (uVar31 >> 7) * lStack_160;
  auVar40._8_8_ = (ulong)((byte)(uVar31 >> 1) & 1) * (long)pdVar30[1];
  auVar40._0_8_ = (ulong)(bVar14 & 1) * (long)*pdVar30;
  auVar40._16_8_ = (ulong)((byte)(uVar31 >> 2) & 1) * (long)pdVar30[2];
  auVar40._24_8_ = (ulong)((byte)(uVar31 >> 3) & 1) * (long)pdVar30[3];
  auVar40._32_8_ = (ulong)((byte)(uVar31 >> 4) & 1) * (long)pdVar30[4];
  auVar40._40_8_ = (ulong)((byte)(uVar31 >> 5) & 1) * (long)pdVar30[5];
  auVar40._48_8_ = (ulong)((byte)(uVar31 >> 6) & 1) * (long)pdVar30[6];
  auVar40._56_8_ = (uVar31 >> 7) * (long)pdVar30[7];
  auVar36 = vmulpd_avx512f(auVar39,auVar36);
  auVar36 = vaddpd_avx512f(auVar36,auVar40);
  bVar15 = (bool)((byte)(uVar31 >> 1) & 1);
  bVar16 = (bool)((byte)(uVar31 >> 2) & 1);
  bVar17 = (bool)((byte)(uVar31 >> 3) & 1);
  bVar18 = (bool)((byte)(uVar31 >> 4) & 1);
  bVar19 = (bool)((byte)(uVar31 >> 5) & 1);
  bVar20 = (bool)((byte)(uVar31 >> 6) & 1);
  *pdVar30 = (double)((ulong)(bVar14 & 1) * auVar36._0_8_ |
                     (ulong)!(bool)(bVar14 & 1) * (long)*pdVar30);
  pdVar30[1] = (double)((ulong)bVar15 * auVar36._8_8_ | (ulong)!bVar15 * (long)pdVar30[1]);
  pdVar30[2] = (double)((ulong)bVar16 * auVar36._16_8_ | (ulong)!bVar16 * (long)pdVar30[2]);
  pdVar30[3] = (double)((ulong)bVar17 * auVar36._24_8_ | (ulong)!bVar17 * (long)pdVar30[3]);
  pdVar30[4] = (double)((ulong)bVar18 * auVar36._32_8_ | (ulong)!bVar18 * (long)pdVar30[4]);
  pdVar30[5] = (double)((ulong)bVar19 * auVar36._40_8_ | (ulong)!bVar19 * (long)pdVar30[5]);
  pdVar30[6] = (double)((ulong)bVar20 * auVar36._48_8_ | (ulong)!bVar20 * (long)pdVar30[6]);
  pdVar30[7] = (double)((uVar31 >> 7) * auVar36._56_8_ |
                       (ulong)!SUB81(uVar31 >> 7,0) * (long)pdVar30[7]);
LAB_005bc92d:
  if (uVar32 < 3) {
    uVar34 = (ulong)(uVar32 << 3);
    auVar35 = vpbroadcastq_avx512vl();
    uVar31 = vpcmpuq_avx512vl(auVar35,_DAT_00955380,5);
    uVar31 = uVar31 & 0xf;
    lVar29 = *(long *)(local_198 + uVar34 + 8);
    lVar21 = *(long *)((long)alStack_188 + uVar34);
    lVar22 = *(long *)((long)CStack_178.m_data + (uVar34 - 8));
    bVar14 = (byte)uVar31;
    plVar1 = (long *)((long)pdVar30 + uVar34);
    lVar23 = plVar1[1];
    lVar24 = plVar1[2];
    lVar25 = plVar1[3];
    puVar2 = (ulong *)((long)pdVar30 + uVar34);
    bVar15 = (bool)((byte)(uVar31 >> 1) & 1);
    bVar16 = (bool)((byte)(uVar31 >> 2) & 1);
    *puVar2 = (ulong)(bVar14 & 1) *
              (long)((double)((ulong)(bVar14 & 1) * *(long *)(local_198 + uVar34)) * local_158 +
                    (double)((ulong)(bVar14 & 1) * *plVar1)) | (ulong)!(bool)(bVar14 & 1) * *puVar2;
    puVar2[1] = (ulong)bVar15 *
                (long)((double)((ulong)((byte)(uVar31 >> 1) & 1) * lVar29) * local_158 +
                      (double)((ulong)((byte)(uVar31 >> 1) & 1) * lVar23)) |
                (ulong)!bVar15 * puVar2[1];
    puVar2[2] = (ulong)bVar16 *
                (long)((double)((ulong)((byte)(uVar31 >> 2) & 1) * lVar21) * local_158 +
                      (double)((ulong)((byte)(uVar31 >> 2) & 1) * lVar24)) |
                (ulong)!bVar16 * puVar2[2];
    puVar2[3] = (uVar31 >> 3) *
                (long)((double)((uVar31 >> 3) * lVar22) * local_158 +
                      (double)((uVar31 >> 3) * lVar25)) | (ulong)!SUB81(uVar31 >> 3,0) * puVar2[3];
  }
  return;
}

Assistant:

void ChLinkMotorLinearForce::IntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    // compute instant force
    double mF = m_func->Get_y(this->GetChTime());

    ChFrame<> aframe1 = this->frame1 >> (*this->Body1);
    ChFrame<> aframe2 = this->frame2 >> (*this->Body2);
    Vector m_abs_force = aframe2.GetA() * ChVector<>(mF, 0, 0);
    Vector mbody_force;
    Vector mbody_torque;

    if (Body2->Variables().IsActive()) {
        Body2->To_abs_forcetorque(m_abs_force,
                                  aframe1.GetPos(),            // absolute application point is always marker1
                                  false,                       // from abs. space
                                  mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
        R.segment(Body2->Variables().GetOffset() + 0, 3) -= c * mbody_force.eigen();
        R.segment(Body2->Variables().GetOffset() + 3, 3) -=
            c * Body2->TransformDirectionParentToLocal(mbody_torque).eigen();
    }

    if (Body1->Variables().IsActive()) {
        Body1->To_abs_forcetorque(m_abs_force,
                                  aframe1.GetPos(),            // absolute application point is always marker1
                                  false,                       // from abs. space
                                  mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
        R.segment(Body1->Variables().GetOffset() + 0, 3) += c * mbody_force.eigen();
        R.segment(Body1->Variables().GetOffset() + 3, 3) +=
            c * Body1->TransformDirectionParentToLocal(mbody_torque).eigen();
    }
}